

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

lua_Number lj_lib_checknum(lua_State *L,int narg)

{
  uint uVar1;
  int iVar2;
  TValue *o;
  
  o = L->base + (long)narg + -1;
  if (o < L->top) {
    uVar1 = *(uint *)((long)L->base + (long)narg * 8 + -4);
    if (uVar1 < 0xffff0000) {
LAB_0013dbc1:
      return (lua_Number)o->u64;
    }
    if (uVar1 == 0xfffffffb) {
      iVar2 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
      if (iVar2 != 0) goto LAB_0013dbc1;
    }
  }
  lj_err_argt(L,narg,3);
}

Assistant:

lua_Number lj_lib_checknum(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top &&
	(tvisnumber(o) || (tvisstr(o) && lj_strscan_num(strV(o), o)))))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_UNLIKELY(tvisint(o))) {
    lua_Number n = (lua_Number)intV(o);
    setnumV(o, n);
    return n;
  } else {
    return numV(o);
  }
}